

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall FOptionMenuItemOption::SetSelection(FOptionMenuItemOption *this,int Selection)

{
  bool bVar1;
  uint uVar2;
  Pair *pPVar3;
  FName local_2c;
  FOptionValues **local_28;
  FOptionValues **opt;
  UCVarValue value;
  FOptionMenuItemOption *pFStack_10;
  int Selection_local;
  FOptionMenuItemOption *this_local;
  
  value._4_4_ = Selection;
  pFStack_10 = this;
  FName::FName(&local_2c,
               (FName *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24);
  local_28 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
             CheckKey(&OptionValues,&local_2c);
  if ((((local_28 != (FOptionValues **)0x0) && (*local_28 != (FOptionValues *)0x0)) &&
      (this->mCVar != (FBaseCVar *)0x0)) &&
     (uVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*local_28)->mValues),
     uVar2 != 0)) {
    pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[](&(*local_28)->mValues,0);
    bVar1 = FString::IsEmpty(&pPVar3->TextValue);
    if (bVar1) {
      pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                         (&(*local_28)->mValues,(long)(int)value._4_4_);
      opt = (FOptionValues **)CONCAT44(opt._4_4_,(float)pPVar3->Value);
      FBaseCVar::SetGenericRep(this->mCVar,(UCVarValue)opt,CVAR_Float);
    }
    else {
      pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                         (&(*local_28)->mValues,(long)(int)value._4_4_);
      opt = (FOptionValues **)FString::LockBuffer(&pPVar3->TextValue);
      FBaseCVar::SetGenericRep(this->mCVar,(UCVarValue)opt,CVAR_String);
      pPVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                         (&(*local_28)->mValues,(long)(int)value._4_4_);
      FString::UnlockBuffer(&pPVar3->TextValue);
    }
  }
  return;
}

Assistant:

void SetSelection(int Selection)
	{
		UCVarValue value;
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && mCVar != NULL && (*opt)->mValues.Size() > 0)
		{
			if ((*opt)->mValues[0].TextValue.IsEmpty())
			{
				value.Float = (float)(*opt)->mValues[Selection].Value;
				mCVar->SetGenericRep (value, CVAR_Float);
			}
			else
			{
				value.String = (*opt)->mValues[Selection].TextValue.LockBuffer();
				mCVar->SetGenericRep (value, CVAR_String);
				(*opt)->mValues[Selection].TextValue.UnlockBuffer();
			}
		}
	}